

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspCliConfig::reset(ClaspCliConfig *this)

{
  std::__cxx11::string::assign((char *)(this->config_ + 1));
  std::__cxx11::string::_M_assign((string *)this->config_);
  this->validate_ = false;
  ClaspConfig::reset(&this->super_ClaspConfig);
  return;
}

Assistant:

void ClaspCliConfig::reset() {
	config_[0] = config_[1] = "";
	validate_  = false;
	ClaspConfig::reset();
}